

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,void *data,int alpha,int pad,
           char *fmt,...)

{
  byte bVar1;
  byte bVar3;
  char in_AL;
  FILE *__stream;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  FILE *pFVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined1 local_98 [8];
  va_list v;
  void *local_50;
  undefined4 local_44;
  uint local_40;
  uint32 zero;
  int local_38;
  byte local_33 [8];
  uint8 px [3];
  byte bVar2;
  FILE *fmt_00;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  zero = x;
  local_38 = comp;
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    v[0].overflow_arg_area = local_148;
    v[0]._0_8_ = &stack0x00000028;
    local_98._0_4_ = 0x30;
    local_98._4_4_ = 0x30;
    writefv((FILE *)__stream,fmt,(__va_list_tag *)local_98);
    local_44 = 0;
    if (y != 0) {
      lVar15 = (long)local_38;
      lVar4 = (long)y;
      lVar5 = (long)(int)zero;
      uVar6 = (ulong)zero;
      lVar11 = lVar15 * lVar5;
      local_50 = (void *)((lVar4 + -1) * lVar11 + (long)data);
      pFVar12 = (FILE *)-lVar11;
      local_40 = local_38 - 1;
      fmt_00 = pFVar12;
      do {
        lVar4 = lVar4 + -1;
        if (0 < (int)zero) {
          uVar16 = 0;
          pvVar14 = local_50;
          do {
            pbVar8 = (byte *)((uVar16 + lVar4 * lVar5) * lVar15 + (long)data);
            if (local_40 < 2) {
              bVar9 = *pbVar8;
              uVar7 = (ulong)(uint)bVar9;
              uVar13 = (ulong)(uint)bVar9;
LAB_001e4283:
              writef((FILE *)__stream,(char *)fmt_00,uVar7,(ulong)bVar9,uVar13);
            }
            else {
              if (local_38 == 3) {
LAB_001e4267:
                bVar9 = pbVar8[1];
                bVar1 = pbVar8[2];
                bVar2 = *pbVar8;
LAB_001e4273:
                uVar13 = (ulong)bVar2;
                uVar7 = (ulong)bVar1;
                goto LAB_001e4283;
              }
              if (local_38 == 4) {
                if (alpha != 0) goto LAB_001e4267;
                bVar3 = pbVar8[3];
                lVar11 = 0;
                do {
                  iVar10 = ((uint)*(byte *)((long)pvVar14 + lVar11) -
                           (uint)(byte)(&DAT_00255bc5)[lVar11]) * (uint)bVar3;
                  iVar10 = (uint)((ulong)((long)iVar10 * 0x80808081) >> 0x27) - (iVar10 >> 0x1f);
                  bVar9 = (char)iVar10 + (&DAT_00255bc5)[lVar11];
                  fmt_00 = (FILE *)(ulong)CONCAT31((int3)((uint)iVar10 >> 8),bVar9);
                  local_33[lVar11] = bVar9;
                  lVar11 = lVar11 + 1;
                  bVar9 = local_33[1];
                  bVar1 = local_33[2];
                  bVar2 = local_33[0];
                } while (lVar11 != 3);
                goto LAB_001e4273;
              }
            }
            if (0 < alpha) {
              fmt_00 = __stream;
              fputc((int)(char)pbVar8[lVar15 + -1],__stream);
            }
            uVar16 = uVar16 + 1;
            pvVar14 = (void *)((long)pvVar14 + lVar15);
          } while (uVar16 != uVar6);
        }
        fmt_00 = (FILE *)(ulong)(uint)pad;
        fwrite(&local_44,(size_t)fmt_00,1,__stream);
        local_50 = (void *)((long)local_50 + (long)pFVar12);
      } while (lVar4 != 0);
    }
    fclose(__stream);
  }
  return (int)(__stream != (FILE *)0x0);
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, void *data, int alpha, int pad, char *fmt, ...)
{
   FILE *f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad);
      fclose(f);
   }
   return f != NULL;
}